

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_hash_table.hpp
# Opt level: O3

uint64_t __thiscall
poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>::find_ass_cbit_
          (compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *this,
          uint64_t slot_id,uint64_t *empty_id)

{
  uint64_t uVar1;
  pointer puVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  
  uVar1 = (this->table_).width_;
  puVar2 = (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar6 = 0;
  uVar7 = (uint)(this->table_).mask_;
  do {
    uVar4 = uVar1 * slot_id;
    uVar5 = (ulong)((uint)uVar4 & 0x3f);
    if (uVar5 + uVar1 < 0x41) {
      uVar8 = (uint)(puVar2[uVar4 >> 6] >> uVar5);
    }
    else {
      bVar3 = (byte)uVar4 & 0x3f;
      uVar8 = (uint)(puVar2[uVar4 >> 6] >> bVar3) | (uint)(puVar2[(uVar4 >> 6) + 1] << 0x40 - bVar3)
      ;
    }
    slot_id = slot_id - 1 & (this->capa_size_).mask_;
    uVar4 = slot_id * uVar1;
    uVar5 = (ulong)((uint)uVar4 & 0x3f);
    if (uVar5 + uVar1 < 0x41) {
      uVar10 = (uint)(puVar2[uVar4 >> 6] >> uVar5);
    }
    else {
      bVar3 = (byte)uVar4 & 0x3f;
      uVar10 = (uint)(puVar2[uVar4 >> 6] >> bVar3) |
               (uint)(puVar2[(uVar4 >> 6) + 1] << 0x40 - bVar3);
    }
    uVar6 = uVar6 + ((uVar8 & uVar7 & 2) >> 1);
  } while ((uVar10 & uVar7 & 0x1fc) != 0x1fc);
  *empty_id = slot_id;
  if (uVar6 == 0) {
    slot_id = 0xffffffffffffffff;
  }
  else {
    uVar1 = (this->table_).width_;
    uVar4 = 0;
    do {
      slot_id = slot_id + 1 & (this->capa_size_).mask_;
      uVar5 = uVar1 * slot_id;
      uVar9 = (ulong)((uint)uVar5 & 0x3f);
      if (uVar9 + uVar1 < 0x41) {
        uVar7 = (uint)(puVar2[uVar5 >> 6] >> uVar9);
      }
      else {
        bVar3 = (byte)uVar5 & 0x3f;
        uVar7 = (uint)(puVar2[uVar5 >> 6] >> bVar3) |
                (uint)(puVar2[(uVar5 >> 6) + 1] << 0x40 - bVar3);
      }
      uVar4 = uVar4 + (uVar7 & (uint)(this->table_).mask_ & 1);
    } while (uVar4 < uVar6);
  }
  return slot_id;
}

Assistant:

uint64_t find_ass_cbit_(uint64_t slot_id, uint64_t& empty_id) const {
        uint64_t num_vbits = 0;
        do {
            if (get_vbit_(slot_id)) {
                ++num_vbits;
            }
            slot_id = left_(slot_id);
        } while (!is_vacant_(slot_id));

        empty_id = slot_id;

        if (num_vbits == 0) {
            return UINT64_MAX;
        }

        uint64_t num_cbits = 0;
        while (num_cbits < num_vbits) {
            slot_id = right_(slot_id);
            if (get_cbit_(slot_id)) {
                ++num_cbits;
            }
        }

        return slot_id;
    }